

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O2

void __thiscall libDAI::FactorGraph::FactorGraph(FactorGraph *this,FactorGraph *x)

{
  (this->super_GraphicalModel)._normType = (x->super_GraphicalModel)._normType;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__FactorGraph_0061e838;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::BipartiteGraph(&this->_fg,&x->_fg);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  ::_Rb_tree(&(this->_backupFactors)._M_t,&(x->_backupFactors)._M_t);
  return;
}

Assistant:

FactorGraph( const FactorGraph & x ) : GraphicalModel(x), _fg(x._fg), _backupFactors(x._backupFactors) {}